

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utImporter.cpp
# Opt level: O3

bool __thiscall TestPlugin::CanRead(TestPlugin *this,string *pFile,IOSystem *param_2,bool param_3)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  string extension;
  long *local_30 [2];
  long local_20 [2];
  
  lVar2 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar2 == -1) {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_30,(ulong)pFile);
    iVar1 = std::__cxx11::string::compare((char *)local_30);
    bVar3 = true;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)local_30);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)local_30);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)local_30);
          bVar3 = iVar1 == 0;
        }
      }
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return bVar3;
}

Assistant:

virtual bool CanRead(
        const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*test*/) const
    {
        std::string::size_type pos = pFile.find_last_of('.');
        // no file extension - can't read
        if( pos == std::string::npos)
            return false;
        std::string extension = pFile.substr( pos);

        // todo ... make case-insensitive
        return (extension == ".apple" || extension == ".mac" ||
            extension == ".linux" || extension == ".windows" );

    }